

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O1

void __thiscall cornerstone::raft_server::handle_voting_resp(raft_server *this,resp_msg *resp)

{
  int iVar1;
  ulong uVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Hash_node_base *p_Var5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_b8 [2];
  long local_a8 [2];
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_98 [2];
  long local_88 [11];
  char *local_30;
  
  uVar2 = (resp->super_msg_base).term_;
  peVar3 = (this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (uVar2 == peVar3->term_) {
    if (this->election_completed_ == true) {
      peVar4 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_98[0] = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,
                 "Election completed, will ignore the voting result from this server","");
      (*peVar4->_vptr_logger[3])(peVar4,local_98);
      local_a8[0] = local_88[0];
      p_Var9 = local_98[0];
      if (local_98[0] ==
          (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)local_88) {
        return;
      }
      goto LAB_00150e81;
    }
    iVar1 = (resp->super_msg_base).src_;
    uVar7 = (this->voted_servers_)._M_h._M_bucket_count;
    uVar8 = (ulong)(long)iVar1 % uVar7;
    p_Var10 = (this->voted_servers_)._M_h._M_buckets[uVar8];
    p_Var11 = (__node_base_ptr)0x0;
    if ((p_Var10 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var10->_M_nxt, p_Var11 = p_Var10, iVar1 != *(int *)&p_Var10->_M_nxt[1]._M_nxt)) {
      while (p_Var10 = p_Var5, p_Var5 = p_Var10->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var11 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var5[1]._M_nxt % uVar7 != uVar8) ||
           (p_Var11 = p_Var10, iVar1 == *(int *)&p_Var5[1]._M_nxt)) goto LAB_00150ef4;
      }
      p_Var11 = (__node_base_ptr)0x0;
    }
LAB_00150ef4:
    if ((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0)) {
      std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base)
      ;
      local_b8[0] = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)CONCAT44(local_b8[0]._4_4_,(resp->super_msg_base).src_);
      local_98[0] = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     *)&this->voted_servers_;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->voted_servers_);
      if (resp->accepted_ == true) {
        this->votes_granted_ = this->votes_granted_ + 1;
      }
      uVar7 = (this->peers_)._M_h._M_element_count + 1;
      if (uVar7 <= (this->voted_servers_)._M_h._M_element_count) {
        this->election_completed_ = true;
      }
      if ((int)(uVar7 >> 1) < this->votes_granted_) {
        peVar4 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_30 = "Server is elected as leader for term %llu";
        snprintf((char *)local_98,100,"Server is elected as leader for term %llu",
                 ((this->state_).
                  super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 term_);
        local_b8[0] = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)local_a8;
        sVar6 = strlen((char *)local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,local_98,(long)local_98 + sVar6);
        (*peVar4->_vptr_logger[3])(peVar4,local_b8);
        if (local_b8[0] !=
            (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             *)local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        this->election_completed_ = true;
        become_leader(this);
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
      return;
    }
    peVar4 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = "Duplicate vote from %d for term %lld";
    snprintf((char *)local_98,100,"Duplicate vote from %d for term %lld",(long)iVar1,peVar3->term_);
    local_b8[0] = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)local_a8;
    sVar6 = strlen((char *)local_98);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,local_98,(long)local_98 + sVar6);
    (*peVar4->_vptr_logger[3])(peVar4,local_b8);
  }
  else {
    peVar4 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30 = "Received an outdated vote response at term %llu v.s. current term %llu";
    snprintf((char *)local_98,100,
             "Received an outdated vote response at term %llu v.s. current term %llu",uVar2,
             peVar3->term_);
    local_b8[0] = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)local_a8;
    sVar6 = strlen((char *)local_98);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,local_98,(long)local_98 + sVar6);
    (*peVar4->_vptr_logger[3])(peVar4,local_b8);
  }
  p_Var9 = local_b8[0];
  if (local_b8[0] ==
      (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
       *)local_a8) {
    return;
  }
LAB_00150e81:
  operator_delete(p_Var9,local_a8[0] + 1);
  return;
}

Assistant:

void raft_server::handle_voting_resp(resp_msg& resp)
{
    if (resp.get_term() != state_->get_term())
    {
        l_->info(sstrfmt("Received an outdated vote response at term %llu v.s. current term %llu")
                     .fmt(resp.get_term(), state_->get_term()));
        return;
    }

    if (election_completed_)
    {
        l_->info("Election completed, will ignore the voting result from this server");
        return;
    }

    if (voted_servers_.find(resp.get_src()) != voted_servers_.end())
    {
        l_->info(sstrfmt("Duplicate vote from %d for term %lld").fmt(resp.get_src(), state_->get_term()));
        return;
    }

    {
        read_lock(peers_lock_);
        voted_servers_.insert(resp.get_src());
        if (resp.get_accepted())
        {
            votes_granted_ += 1;
        }

        if (voted_servers_.size() >= (peers_.size() + 1))
        {
            election_completed_ = true;
        }

        if (votes_granted_ > (int32)((peers_.size() + 1) / 2))
        {
            l_->info(sstrfmt("Server is elected as leader for term %llu").fmt(state_->get_term()));
            election_completed_ = true;
            become_leader();
        }
    }
}